

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicList::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,uint index)

{
  StructBuilder other;
  ElementSize EVar1;
  Which WVar2;
  Orphan<capnp::DynamicValue> *pOVar3;
  BuilderArena *pBVar4;
  StructSchema schema;
  Orphan<capnp::DynamicStruct> result_1;
  Orphan<capnp::DynamicValue> result;
  StructBuilder element;
  Builder local_b0;
  Builder local_70;
  
  WVar2 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar2 = (this->schema).elementType.baseType;
  }
  if (WVar2 < (ANY_POINTER|BOOL)) {
    if ((0x8fffU >> (WVar2 & 0x1f) & 1) != 0) {
      operator[](&local_70,this,index);
      result_1.builder.segment = (SegmentBuilder *)0x0;
      result_1.builder.capTable = (CapTableBuilder *)0x0;
      result_1.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
      result_1.builder.tag.content = 0;
      Orphan<capnp::DynamicValue>::Orphan(&result,&local_70,(OrphanBuilder *)&result_1);
      _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&result_1);
      DynamicValue::Builder::~Builder(&local_70);
      WVar2 = LIST;
      if ((this->schema).elementType.listDepth == '\0') {
        WVar2 = (this->schema).elementType.baseType;
      }
      EVar1 = anon_unknown_71::elementSizeFor(WVar2);
      pOVar3 = (Orphan<capnp::DynamicValue> *)
               (*(code *)(&DAT_0018021c + *(int *)(&DAT_0018021c + (ulong)EVar1 * 4)))();
      return pOVar3;
    }
    if ((0x67000U >> (WVar2 & 0x1f) & 1) == 0) {
      result.builder.segment = *(SegmentBuilder **)&(this->builder).structDataSize;
      result._0_8_ = (this->builder).segment;
      result.field_1.intValue = (int64_t)(this->builder).capTable;
      result.field_1.listSchema.elementType.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(this->builder).ptr;
      result.builder.tag.content._0_4_ = (this->builder).elementCount;
      result.builder.tag.content._4_4_ = (this->builder).step;
      pBVar4 = _::ListBuilder::getArena((ListBuilder *)&result);
      result.field_1.intValue = (int64_t)_::ListBuilder::getCapTable((ListBuilder *)&result);
      result._0_8_ = pBVar4;
      schema = Type::asStruct((Type *)this);
      Orphanage::newOrphan(&result_1,(Orphanage *)&result,schema);
      _::ListBuilder::getStructElement(&element,&this->builder,index);
      Orphan<capnp::DynamicStruct>::get((Builder *)&result,&result_1);
      other.capTable = element.capTable;
      other.segment = element.segment;
      other.data = element.data;
      other.pointers = element.pointers;
      other.dataSize = element.dataSize;
      other.pointerCount = element.pointerCount;
      other._38_2_ = element._38_2_;
      _::StructBuilder::transferContentFrom((StructBuilder *)&result.field_1.enumValue,other);
      _::StructBuilder::clearAll(&element);
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,&result_1);
      _::OrphanBuilder::~OrphanBuilder(&result_1.builder);
    }
    else {
      operator[]((Builder *)&result,this,index);
      DynamicValue::Builder::Builder(&local_b0,(Builder *)&result);
      element.data = (this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3);
      element.segment = (this->builder).segment;
      element.capTable = (this->builder).capTable;
      _::PointerBuilder::disown((OrphanBuilder *)&result_1,(PointerBuilder *)&element);
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,&local_b0,(OrphanBuilder *)&result_1);
      _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&result_1);
      DynamicValue::Builder::~Builder(&local_b0);
      DynamicValue::Builder::~Builder((Builder *)&result);
    }
    return __return_storage_ptr__;
  }
  kj::_::unreachable();
}

Assistant:

Orphan<DynamicValue> DynamicList::Builder::disown(uint index) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM: {
      auto result = Orphan<DynamicValue>(operator[](index), _::OrphanBuilder());
      switch (elementSizeFor(schema.whichElementType())) {
        case ElementSize::VOID: break;
        case ElementSize::BIT: builder.setDataElement<bool>(bounded(index) * ELEMENTS, false); break;
        case ElementSize::BYTE: builder.setDataElement<uint8_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::TWO_BYTES: builder.setDataElement<uint16_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::FOUR_BYTES: builder.setDataElement<uint32_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::EIGHT_BYTES: builder.setDataElement<uint64_t>(bounded(index) * ELEMENTS, 0);break;

        case ElementSize::POINTER:
        case ElementSize::INLINE_COMPOSITE:
          KJ_UNREACHABLE;
      }
      return kj::mv(result);
    }

    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::LIST:
    case schema::Type::ANY_POINTER:
    case schema::Type::INTERFACE: {
      auto value = operator[](index);
      return Orphan<DynamicValue>(value, builder.getPointerElement(bounded(index) * ELEMENTS).disown());
    }

    case schema::Type::STRUCT: {
      // We have to make a copy.
      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(schema.getStructElementType());
      auto element = builder.getStructElement(bounded(index) * ELEMENTS);
      result.get().builder.transferContentFrom(element);
      element.clearAll();
      return kj::mv(result);
    }
  }
  KJ_UNREACHABLE;
}